

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ParseUri(char *zDefaultVfs,char *zUri,uint *pFlags,sqlite3_vfs **ppVfs,char **pzFile,
                   char **pzErrMsg)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  int iVar4;
  size_t sVar5;
  undefined4 *puVar6;
  sqlite3_vfs *psVar7;
  char *pcVar8;
  char *pcVar9;
  ulong uVar10;
  uint uVar11;
  ulong n;
  char *__s;
  int iVar12;
  long lVar13;
  uint uVar14;
  byte bVar15;
  char *__s_00;
  int *__s_01;
  uint uVar16;
  OpenMode *pOVar17;
  uint local_60;
  uint local_5c;
  
  uVar16 = *pFlags;
  if (zUri == (char *)0x0) {
    uVar11 = 0;
LAB_0019d215:
    iVar4 = sqlite3_initialize();
    if (iVar4 != 0) {
      return 7;
    }
    puVar6 = (undefined4 *)sqlite3Malloc((ulong)(uVar11 + 8));
    if (puVar6 == (undefined4 *)0x0) {
      return 7;
    }
    *puVar6 = 0;
    __s = (char *)(puVar6 + 1);
    if (uVar11 == 0) {
      uVar10 = 0;
    }
    else {
      uVar10 = (ulong)uVar11;
      memcpy(__s,zUri,uVar10);
    }
    pcVar8 = __s + uVar10;
    pcVar8[0] = '\0';
    pcVar8[1] = '\0';
    pcVar8[2] = '\0';
    pcVar8[3] = '\0';
    uVar16 = uVar16 & 0xffffffbf;
    goto LAB_0019d309;
  }
  sVar5 = strlen(zUri);
  uVar11 = (uint)sVar5 & 0x3fffffff;
  if ((uVar16 & 0x40) != 0) {
    if (4 < uVar11) goto LAB_0019d201;
    goto LAB_0019d215;
  }
  if (sqlite3Config.bOpenUri == '\0' || uVar11 < 5) goto LAB_0019d215;
LAB_0019d201:
  if (zUri[4] != ':' || *(int *)zUri != 0x656c6966) goto LAB_0019d215;
  n = (ulong)(uVar11 + 8);
  uVar16 = uVar16 | 0x40;
  uVar10 = 0;
  do {
    n = n + (zUri[uVar10] == '&');
    uVar10 = uVar10 + 1;
  } while (((uint)sVar5 & 0x3fffffff) != uVar10);
  iVar4 = sqlite3_initialize();
  if (iVar4 != 0) {
    return 7;
  }
  puVar6 = (undefined4 *)sqlite3Malloc(n);
  if (puVar6 == (undefined4 *)0x0) {
    return 7;
  }
  *puVar6 = 0;
  __s = (char *)(puVar6 + 1);
  uVar10 = 5;
  if ((zUri[5] != '/') || (zUri[6] != '/')) {
LAB_0019d3b6:
    iVar12 = 0;
    iVar4 = 0;
    do {
      lVar13 = (long)iVar4;
      uVar10 = uVar10 & 0xffffffff;
LAB_0019d3c7:
      uVar11 = (uint)uVar10;
      bVar15 = zUri[(int)uVar11];
      if ((bVar15 == 0) || (bVar15 == 0x23)) {
        if (iVar12 == 1) {
          __s[lVar13] = '\0';
          lVar13 = (long)(iVar4 + 1);
        }
        pcVar8 = __s + lVar13;
        pcVar8[0] = '\0';
        pcVar8[1] = '\0';
        pcVar8[2] = '\0';
        pcVar8[3] = '\0';
        sVar5 = strlen(__s);
        uVar10 = (ulong)((uint)sVar5 & 0x3fffffff);
        if (*(char *)((long)puVar6 + uVar10 + 5) == '\0') goto LAB_0019d309;
        __s_01 = (int *)(__s + uVar10 + 1);
        goto LAB_0019d579;
      }
      uVar14 = uVar11 + 1;
      uVar10 = (ulong)uVar14;
      if (((bVar15 == 0x25) && (bVar1 = zUri[(int)uVar14], (""[bVar1] & 8) != 0)) &&
         (bVar2 = zUri[(long)(int)uVar11 + 2], (""[bVar2] & 8) != 0)) {
        uVar10 = (ulong)(uVar11 + 3);
        bVar15 = ((char)(bVar2 * '\x02') >> 7 & 9U) + bVar2 & 0xf |
                 (((char)(bVar1 * '\x02') >> 7 & 9U) + bVar1) * '\x10';
        if (bVar15 != 0) goto LAB_0019d4ee;
        for (pcVar8 = zUri + (int)(uVar11 + 3);
            ((cVar3 = *pcVar8, cVar3 != '\0' && (cVar3 != '#')) && ((iVar12 != 0 || (cVar3 != '?')))
            ); pcVar8 = pcVar8 + 1) {
          if (iVar12 == 1) {
            if ((cVar3 == '&') || (cVar3 == '=')) break;
          }
          else if ((iVar12 == 2) && (cVar3 == '&')) break;
          uVar10 = (ulong)((int)uVar10 + 1);
        }
        goto LAB_0019d3c7;
      }
      if (iVar12 != 1) {
        if (((iVar12 != 0) || (bVar15 != 0x3f)) && ((iVar12 != 2 || (bVar15 != 0x26))))
        goto LAB_0019d4ee;
LAB_0019d522:
        iVar12 = 1;
        goto LAB_0019d535;
      }
      if ((bVar15 != 0x3d) && (bVar15 != 0x26)) {
        iVar12 = 1;
        goto LAB_0019d4ee;
      }
      if (*(char *)((long)puVar6 + lVar13 + 3) == '\0') {
        pcVar8 = zUri + (int)uVar14;
        while( true ) {
          uVar11 = uVar11 + 1;
          uVar10 = (ulong)uVar11;
          iVar12 = 1;
          if (((*pcVar8 == '\0') || (*pcVar8 == '#')) || (pcVar8[-1] == '&')) break;
          pcVar8 = pcVar8 + 1;
        }
        goto LAB_0019d3c7;
      }
      if (bVar15 == 0x26) {
        iVar4 = iVar4 + 1;
        __s[lVar13] = '\0';
        lVar13 = (long)iVar4;
        goto LAB_0019d522;
      }
      iVar12 = 2;
LAB_0019d535:
      bVar15 = 0;
LAB_0019d4ee:
      iVar4 = iVar4 + 1;
      __s[lVar13] = bVar15;
    } while( true );
  }
  for (lVar13 = 0; (zUri[lVar13 + 7] != '\0' && (zUri[lVar13 + 7] != '/')); lVar13 = lVar13 + 1) {
  }
  uVar10 = lVar13 + 7;
  if ((int)uVar10 == 0x10) {
    if (zUri[0xf] == 't' && *(long *)(zUri + 7) == 0x736f686c61636f6c) {
      uVar10 = 0x10;
      goto LAB_0019d3b6;
    }
  }
  else if ((int)uVar10 == 7) goto LAB_0019d3b6;
  pcVar8 = sqlite3_mprintf("invalid uri authority: %.*s",lVar13,zUri + 7);
LAB_0019d704:
  iVar4 = 1;
  goto LAB_0019d338;
LAB_0019d579:
  do {
    sVar5 = strlen((char *)__s_01);
    uVar14 = (uint)sVar5 & 0x3fffffff;
    pcVar8 = (char *)((long)__s_01 + (ulong)uVar14 + 1);
    sVar5 = strlen(pcVar8);
    uVar11 = (uint)sVar5;
    if (uVar14 == 5) {
      if ((char)__s_01[1] == 'e' && *__s_01 == 0x68636163) {
        local_5c = 0x60000;
        local_60 = 0xfff9ffff;
        pOVar17 = sqlite3ParseUri::aCacheMode;
        pcVar9 = "cache";
LAB_0019d66d:
        __s_00 = pOVar17->z;
        if (__s_00 != (char *)0x0) {
          while( true ) {
            sVar5 = strlen(__s_00);
            if (((((uint)sVar5 ^ uVar11) & 0x3fffffff) == 0) &&
               (iVar4 = bcmp(pcVar8,__s_00,(ulong)(uVar11 & 0x3fffffff)), iVar4 == 0)) break;
            __s_00 = pOVar17[1].z;
            pOVar17 = pOVar17 + 1;
            if (__s_00 == (char *)0x0) goto LAB_0019d6ec;
          }
          uVar14 = pOVar17->mode;
          if (uVar14 != 0) {
            if ((int)(uVar14 & 0xffffff7f) <= (int)local_5c) {
              uVar16 = uVar14 | local_60 & uVar16;
              goto LAB_0019d628;
            }
            pcVar8 = sqlite3_mprintf("%s mode not allowed: %s",pcVar9,pcVar8);
            iVar4 = 3;
            goto LAB_0019d338;
          }
        }
LAB_0019d6ec:
        pcVar8 = sqlite3_mprintf("no such %s mode: %s",pcVar9,pcVar8);
        goto LAB_0019d704;
      }
    }
    else if (uVar14 == 4) {
      if (*__s_01 == 0x65646f6d) {
        local_5c = uVar16 & 0x87;
        local_60 = 0xffffff78;
        pOVar17 = sqlite3ParseUri::aOpenMode;
        pcVar9 = "access";
        goto LAB_0019d66d;
      }
    }
    else if ((uVar14 == 3) && (*(char *)((long)__s_01 + 2) == 's' && (short)*__s_01 == 0x6676)) {
      zDefaultVfs = pcVar8;
    }
LAB_0019d628:
    __s_01 = (int *)(pcVar8 + (ulong)(uVar11 & 0x3fffffff) + 1);
  } while ((char)*__s_01 != '\0');
LAB_0019d309:
  psVar7 = sqlite3_vfs_find(zDefaultVfs);
  *ppVfs = psVar7;
  iVar4 = 0;
  if (psVar7 != (sqlite3_vfs *)0x0) goto LAB_0019d34a;
  pcVar8 = sqlite3_mprintf("no such vfs: %s",zDefaultVfs);
  iVar4 = 1;
LAB_0019d338:
  *pzErrMsg = pcVar8;
  sqlite3_free_filename(__s);
  __s = (char *)0x0;
LAB_0019d34a:
  *pFlags = uVar16;
  *pzFile = __s;
  return iVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3ParseUri(
  const char *zDefaultVfs,        /* VFS to use if no "vfs=xxx" query option */
  const char *zUri,               /* Nul-terminated URI to parse */
  unsigned int *pFlags,           /* IN/OUT: SQLITE_OPEN_XXX flags */
  sqlite3_vfs **ppVfs,            /* OUT: VFS to use */
  char **pzFile,                  /* OUT: Filename component of URI */
  char **pzErrMsg                 /* OUT: Error message (if rc!=SQLITE_OK) */
){
  int rc = SQLITE_OK;
  unsigned int flags = *pFlags;
  const char *zVfs = zDefaultVfs;
  char *zFile;
  char c;
  int nUri = sqlite3Strlen30(zUri);

  assert( *pzErrMsg==0 );

  if( ((flags & SQLITE_OPEN_URI)                     /* IMP: R-48725-32206 */
       || AtomicLoad(&sqlite3GlobalConfig.bOpenUri)) /* IMP: R-51689-46548 */
   && nUri>=5 && memcmp(zUri, "file:", 5)==0         /* IMP: R-57884-37496 */
  ){
    char *zOpt;
    int eState;                   /* Parser state when parsing URI */
    int iIn;                      /* Input character index */
    int iOut = 0;                 /* Output character index */
    u64 nByte = nUri+8;           /* Bytes of space to allocate */

    /* Make sure the SQLITE_OPEN_URI flag is set to indicate to the VFS xOpen
    ** method that there may be extra parameters following the file-name.  */
    flags |= SQLITE_OPEN_URI;

    for(iIn=0; iIn<nUri; iIn++) nByte += (zUri[iIn]=='&');
    zFile = sqlite3_malloc64(nByte);
    if( !zFile ) return SQLITE_NOMEM_BKPT;

    memset(zFile, 0, 4);  /* 4-byte of 0x00 is the start of DB name marker */
    zFile += 4;

    iIn = 5;
#ifdef SQLITE_ALLOW_URI_AUTHORITY
    if( strncmp(zUri+5, "///", 3)==0 ){
      iIn = 7;
      /* The following condition causes URIs with five leading / characters
      ** like file://///host/path to be converted into UNCs like //host/path.
      ** The correct URI for that UNC has only two or four leading / characters
      ** file://host/path or file:////host/path.  But 5 leading slashes is a
      ** common error, we are told, so we handle it as a special case. */
      if( strncmp(zUri+7, "///", 3)==0 ){ iIn++; }
    }else if( strncmp(zUri+5, "//localhost/", 12)==0 ){
      iIn = 16;
    }
#else
    /* Discard the scheme and authority segments of the URI. */
    if( zUri[5]=='/' && zUri[6]=='/' ){
      iIn = 7;
      while( zUri[iIn] && zUri[iIn]!='/' ) iIn++;
      if( iIn!=7 && (iIn!=16 || memcmp("localhost", &zUri[7], 9)) ){
        *pzErrMsg = sqlite3_mprintf("invalid uri authority: %.*s",
            iIn-7, &zUri[7]);
        rc = SQLITE_ERROR;
        goto parse_uri_out;
      }
    }
#endif

    /* Copy the filename and any query parameters into the zFile buffer.
    ** Decode %HH escape codes along the way.
    **
    ** Within this loop, variable eState may be set to 0, 1 or 2, depending
    ** on the parsing context. As follows:
    **
    **   0: Parsing file-name.
    **   1: Parsing name section of a name=value query parameter.
    **   2: Parsing value section of a name=value query parameter.
    */
    eState = 0;
    while( (c = zUri[iIn])!=0 && c!='#' ){
      iIn++;
      if( c=='%'
       && sqlite3Isxdigit(zUri[iIn])
       && sqlite3Isxdigit(zUri[iIn+1])
      ){
        int octet = (sqlite3HexToInt(zUri[iIn++]) << 4);
        octet += sqlite3HexToInt(zUri[iIn++]);

        assert( octet>=0 && octet<256 );
        if( octet==0 ){
#ifndef SQLITE_ENABLE_URI_00_ERROR
          /* This branch is taken when "%00" appears within the URI. In this
          ** case we ignore all text in the remainder of the path, name or
          ** value currently being parsed. So ignore the current character
          ** and skip to the next "?", "=" or "&", as appropriate. */
          while( (c = zUri[iIn])!=0 && c!='#'
              && (eState!=0 || c!='?')
              && (eState!=1 || (c!='=' && c!='&'))
              && (eState!=2 || c!='&')
          ){
            iIn++;
          }
          continue;
#else
          /* If ENABLE_URI_00_ERROR is defined, "%00" in a URI is an error. */
          *pzErrMsg = sqlite3_mprintf("unexpected %%00 in uri");
          rc = SQLITE_ERROR;
          goto parse_uri_out;
#endif
        }
        c = octet;
      }else if( eState==1 && (c=='&' || c=='=') ){
        if( zFile[iOut-1]==0 ){
          /* An empty option name. Ignore this option altogether. */
          while( zUri[iIn] && zUri[iIn]!='#' && zUri[iIn-1]!='&' ) iIn++;
          continue;
        }
        if( c=='&' ){
          zFile[iOut++] = '\0';
        }else{
          eState = 2;
        }
        c = 0;
      }else if( (eState==0 && c=='?') || (eState==2 && c=='&') ){
        c = 0;
        eState = 1;
      }
      zFile[iOut++] = c;
    }
    if( eState==1 ) zFile[iOut++] = '\0';
    memset(zFile+iOut, 0, 4); /* end-of-options + empty journal filenames */

    /* Check if there were any options specified that should be interpreted
    ** here. Options that are interpreted here include "vfs" and those that
    ** correspond to flags that may be passed to the sqlite3_open_v2()
    ** method. */
    zOpt = &zFile[sqlite3Strlen30(zFile)+1];
    while( zOpt[0] ){
      int nOpt = sqlite3Strlen30(zOpt);
      char *zVal = &zOpt[nOpt+1];
      int nVal = sqlite3Strlen30(zVal);

      if( nOpt==3 && memcmp("vfs", zOpt, 3)==0 ){
        zVfs = zVal;
      }else{
        struct OpenMode {
          const char *z;
          int mode;
        } *aMode = 0;
        char *zModeType = 0;
        int mask = 0;
        int limit = 0;

        if( nOpt==5 && memcmp("cache", zOpt, 5)==0 ){
          static struct OpenMode aCacheMode[] = {
            { "shared",  SQLITE_OPEN_SHAREDCACHE },
            { "private", SQLITE_OPEN_PRIVATECACHE },
            { 0, 0 }
          };

          mask = SQLITE_OPEN_SHAREDCACHE|SQLITE_OPEN_PRIVATECACHE;
          aMode = aCacheMode;
          limit = mask;
          zModeType = "cache";
        }
        if( nOpt==4 && memcmp("mode", zOpt, 4)==0 ){
          static struct OpenMode aOpenMode[] = {
            { "ro",  SQLITE_OPEN_READONLY },
            { "rw",  SQLITE_OPEN_READWRITE },
            { "rwc", SQLITE_OPEN_READWRITE | SQLITE_OPEN_CREATE },
            { "memory", SQLITE_OPEN_MEMORY },
            { 0, 0 }
          };

          mask = SQLITE_OPEN_READONLY | SQLITE_OPEN_READWRITE
                   | SQLITE_OPEN_CREATE | SQLITE_OPEN_MEMORY;
          aMode = aOpenMode;
          limit = mask & flags;
          zModeType = "access";
        }

        if( aMode ){
          int i;
          int mode = 0;
          for(i=0; aMode[i].z; i++){
            const char *z = aMode[i].z;
            if( nVal==sqlite3Strlen30(z) && 0==memcmp(zVal, z, nVal) ){
              mode = aMode[i].mode;
              break;
            }
          }
          if( mode==0 ){
            *pzErrMsg = sqlite3_mprintf("no such %s mode: %s", zModeType, zVal);
            rc = SQLITE_ERROR;
            goto parse_uri_out;
          }
          if( (mode & ~SQLITE_OPEN_MEMORY)>limit ){
            *pzErrMsg = sqlite3_mprintf("%s mode not allowed: %s",
                                        zModeType, zVal);
            rc = SQLITE_PERM;
            goto parse_uri_out;
          }
          flags = (flags & ~mask) | mode;
        }
      }

      zOpt = &zVal[nVal+1];
    }

  }else{
    zFile = sqlite3_malloc64(nUri+8);
    if( !zFile ) return SQLITE_NOMEM_BKPT;
    memset(zFile, 0, 4);
    zFile += 4;
    if( nUri ){
      memcpy(zFile, zUri, nUri);
    }
    memset(zFile+nUri, 0, 4);
    flags &= ~SQLITE_OPEN_URI;
  }

  *ppVfs = sqlite3_vfs_find(zVfs);
  if( *ppVfs==0 ){
    *pzErrMsg = sqlite3_mprintf("no such vfs: %s", zVfs);
    rc = SQLITE_ERROR;
  }
 parse_uri_out:
  if( rc!=SQLITE_OK ){
    sqlite3_free_filename(zFile);
    zFile = 0;
  }
  *pFlags = flags;
  *pzFile = zFile;
  return rc;
}